

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> * __thiscall
tiger::trains::world::World::getEventsAfter(World *this,int startTick)

{
  bool bVar1;
  __normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
  *p_Var2;
  int in_EDX;
  long in_RSI;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *in_RDI;
  IEvent *event;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  size_t i;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *res;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
  *__lhs;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *this_00;
  __normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
  local_30;
  const_reference local_28;
  __normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
  *local_20;
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  this_00 = in_RDI;
  local_14 = in_EDX;
  std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>::
  vector((vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *)
         0x224653);
  local_20 = (__normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
              *)(long)local_14;
  while (__lhs = local_20,
        p_Var2 = (__normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
                  *)std::
                    vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                    ::size((vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                            *)(in_RSI + 0x330)), __lhs < p_Var2) {
    local_28 = std::
               vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
               ::operator[]((vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                             *)(in_RSI + 0x330),(size_type)local_20);
    local_30._M_current =
         (IEvent **)
         std::
         vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>::
         begin(in_stack_ffffffffffffff88);
    std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>::
    end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             (__lhs,(__normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
                                     *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
      ::operator*(&local_30);
      std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>::
      push_back(this_00,(value_type *)in_RDI);
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
      ::operator++(&local_30);
    }
    local_20 = (__normal_iterator<tiger::trains::world::IEvent_*const_*,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
                *)((long)&local_20->_M_current + 1);
  }
  return this_00;
}

Assistant:

const std::vector<IEvent *> World::getEventsAfter(int startTick) const
{
    std::vector<IEvent *> res;

    for (size_t i=startTick; i<eventsHistory.size(); i++)
        for (IEvent *event: eventsHistory[i])
            res.push_back(event);

    return res;
}